

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_to_hex.h
# Opt level: O2

void __thiscall
fmt::v11::
formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,char,void>
::put_newline<fmt::v11::basic_appender<char>>
          (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,char,void>
           *this,basic_appender<char> inserter,size_t pos)

{
  format_string_checker<char,_1,_0,_false> *in_RCX;
  basic_string_view<char> fmt;
  string_view fmt_00;
  format_args args;
  basic_appender<char> inserter_local;
  basic_appender<char> local_68;
  undefined8 local_60;
  undefined4 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  basic_appender<char> *local_38;
  code *local_30;
  
  inserter_local = inserter;
  local_68.container = inserter.container;
  basic_appender<char>::operator=(&local_68,'\n');
  if (this[4] ==
      (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,char,void>
       )0x1) {
    local_68.container._0_4_ = 4;
    local_60 = 0;
    local_58 = 0;
    local_50 = "{:04X}: ";
    local_48 = 8;
    local_40 = 0x100000000;
    local_30 = detail::invoke_parse<unsigned_long&,char>;
    fmt.size_ = (size_t)&local_68;
    fmt.data_ = (char *)0x8;
    local_38 = &local_68;
    detail::parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:04X}: ",fmt,in_RCX);
    fmt_00.size_ = 8;
    fmt_00.data_ = "{:04X}: ";
    args.field_1.values_ = (value<fmt::v11::context> *)&local_68;
    args.desc_ = 4;
    local_68.container = (buffer<char> *)pos;
    vformat_to<fmt::v11::basic_appender<char>_&,_0>(&inserter_local,fmt_00,args);
  }
  return;
}

Assistant:

void put_newline(It inserter, std::size_t pos) const {
#ifdef _WIN32
        *inserter++ = '\r';
#endif
        *inserter++ = '\n';

        if (put_positions) {
            spdlog::fmt_lib::format_to(inserter, SPDLOG_FMT_STRING("{:04X}: "), pos);
        }
    }